

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  AttributeInstanceSyntax *pAVar1;
  Token *unaff_retaddr;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *in_stack_00000008;
  Token *in_stack_00000010;
  Token *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  BumpAllocator *in_stack_000000e8;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *in_stack_000000f0;
  
  parsing::Token::deepClone((Token *)in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone((Token *)in_stack_000000f0,in_stack_000000e8);
  deepClone<slang::syntax::AttributeSpecSyntax>(in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone((Token *)in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone((Token *)in_stack_000000f0,in_stack_000000e8);
  pAVar1 = BumpAllocator::
           emplace<slang::syntax::AttributeInstanceSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,(Token *)__fn);
  return (int)pAVar1;
}

Assistant:

static SyntaxNode* clone(const AttributeInstanceSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<AttributeInstanceSyntax>(
        node.openParen.deepClone(alloc),
        node.openStar.deepClone(alloc),
        *deepClone(node.specs, alloc),
        node.closeStar.deepClone(alloc),
        node.closeParen.deepClone(alloc)
    );
}